

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void nghttp2_session_detach_idle_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream *next_stream;
  nghttp2_stream *prev_stream;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  pnVar1 = stream->closed_prev;
  pnVar2 = stream->closed_next;
  if (pnVar1 == (nghttp2_stream *)0x0) {
    session->idle_stream_head = pnVar2;
  }
  else {
    pnVar1->closed_next = pnVar2;
  }
  if (pnVar2 == (nghttp2_stream *)0x0) {
    session->idle_stream_tail = pnVar1;
  }
  else {
    pnVar2->closed_prev = pnVar1;
  }
  stream->closed_prev = (nghttp2_stream *)0x0;
  stream->closed_next = (nghttp2_stream *)0x0;
  session->num_idle_streams = session->num_idle_streams - 1;
  return;
}

Assistant:

void nghttp2_session_detach_idle_stream(nghttp2_session *session,
                                        nghttp2_stream *stream) {
  nghttp2_stream *prev_stream, *next_stream;

  DEBUGF("stream: detach idle stream(%p)=%d, state=%d\n", stream,
         stream->stream_id, stream->state);

  prev_stream = stream->closed_prev;
  next_stream = stream->closed_next;

  if (prev_stream) {
    prev_stream->closed_next = next_stream;
  } else {
    session->idle_stream_head = next_stream;
  }

  if (next_stream) {
    next_stream->closed_prev = prev_stream;
  } else {
    session->idle_stream_tail = prev_stream;
  }

  stream->closed_prev = NULL;
  stream->closed_next = NULL;

  --session->num_idle_streams;
}